

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringhelpers.h
# Opt level: O0

bool chibi::eat_word_v2(char **line,char **word)

{
  bool bVar1;
  bool local_25;
  bool local_22;
  bool isQuoted;
  char **word_local;
  char **line_local;
  
  while( true ) {
    local_22 = false;
    if (**line != '\0') {
      local_22 = is_whitespace(**line);
    }
    if (local_22 == false) break;
    *line = *line + 1;
  }
  if (**line == '\0') {
    line_local._7_1_ = false;
  }
  else {
    if (**line == '\"') {
      *line = *line + 1;
      *word = *line;
      while( true ) {
        bVar1 = false;
        if (**line != '\0') {
          bVar1 = **line != '\"';
        }
        if (!bVar1) break;
        *line = *line + 1;
      }
    }
    else {
      *word = *line;
      while( true ) {
        bVar1 = false;
        if (**line != '\0') {
          bVar1 = is_whitespace(**line);
          bVar1 = !bVar1;
        }
        if (!bVar1) break;
        *line = *line + 1;
      }
    }
    if (*word < *line) {
      if (**line != '\0') {
        **line = '\0';
        *line = *line + 1;
      }
      while( true ) {
        local_25 = false;
        if (**line != '\0') {
          local_25 = is_whitespace(**line);
        }
        if (local_25 == false) break;
        *line = *line + 1;
      }
      line_local._7_1_ = true;
    }
    else {
      line_local._7_1_ = false;
    }
  }
  return line_local._7_1_;
}

Assistant:

static bool eat_word_v2(char *& line, const char *& word)
	{
		while (*line != 0 && is_whitespace(*line) == true)
			line++;
		
		if (*line == 0)
			return false;
		
		const bool isQuoted = *line == '"';

		if (isQuoted)
		{
			line++;

			word = line;
			
			while (*line != 0 && *line != '"')
				line++;
		}
		else
		{
			word = line;
			
			while (*line != 0 && is_whitespace(*line) == false)
				line++;
		}
		
		if (line > word)
		{
			// null-terminate the extracted text
			
			if (*line != 0)
			{
				*line = 0;
				line++;
			}

			// make sure to increment the line pointer until we reach non-whitespace territory again

			while (*line != 0 && is_whitespace(*line))
				line++;
			
			return true;
		}
		else
		{
			return false;
		}
	}